

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_mul_ppc64(float128 a,float128 b,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte zSign;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  int32_t zExp;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float128 fVar18;
  int32_t bExp;
  int32_t aExp;
  uint64_t bSig1;
  uint64_t bSig0;
  uint64_t aSig0;
  uint32_t aLow;
  uint64_t aSig1;
  uint local_98;
  uint local_94;
  ulong local_90;
  uint64_t local_88;
  ulong local_80;
  ulong local_78;
  float_status *local_70;
  ulong local_68;
  ulong local_60;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = a.low;
  uVar6 = b.low;
  local_78 = a.high & 0xffffffffffff;
  local_94 = a.high._6_2_ & 0x7fff;
  uVar14 = b.high & 0xffffffffffff;
  local_98 = b.high._6_2_ & 0x7fff;
  uVar8 = b.high ^ a.high;
  local_88 = uVar6;
  local_80 = uVar14;
  if (local_94 == 0x7fff) {
    if ((((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
         local_58 != 0) ||
       ((((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar6 != 0) && local_98 == 0x7fff)) {
LAB_00b438ac:
      fVar18 = propagateFloat128NaN(a,b,status);
      return fVar18;
    }
    if ((((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        uVar6 == 0) &&
        ((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
LAB_00b43b1d:
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar8 = 0x7fff800000000000;
      goto LAB_00b43b2d;
    }
  }
  else {
    if (local_98 != 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            local_58 == 0) goto LAB_00b43b4a;
        normalizeFloat128Subnormal(local_78,local_58,(int32_t *)&local_94,&local_78,&local_58);
      }
      if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
            uVar6 == 0) {
LAB_00b43b4a:
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar8 & 0x8000000000000000;
          return (float128)(auVar1 << 0x40);
        }
        normalizeFloat128Subnormal(uVar14,uVar6,(int32_t *)&local_98,&local_80,&local_88);
      }
      uVar12 = local_78 | 0x1000000000000;
      uVar14 = local_80 << 0x10;
      uVar7 = local_88 >> 0x30;
      local_80 = uVar14 | uVar7;
      local_88 = local_88 * 0x10000;
      uVar11 = local_58 >> 0x20;
      local_40 = local_88 >> 0x20;
      local_68 = local_58;
      uVar4 = (local_58 & 0xffffffff) * local_40;
      uVar15 = uVar11 * (local_88 & 0xffffffff);
      uVar16 = uVar15 + uVar4;
      local_60 = local_58 * local_88;
      uVar5 = uVar14 >> 0x20;
      uVar3 = (local_58 & 0xffffffff) * uVar5;
      uVar7 = uVar14 & 0xffffffff | uVar7;
      uVar9 = uVar11 * uVar7;
      uVar10 = uVar9 + uVar3;
      local_50 = uVar10 >> 0x20;
      uVar14 = local_58 * local_80;
      local_48 = (ulong)(uVar14 < uVar10 << 0x20);
      uVar15 = uVar11 * local_40 + uVar14 + (uVar16 >> 0x20) + ((ulong)CARRY8(uVar15,uVar4) << 0x20)
               + (ulong)(local_60 < uVar16 << 0x20);
      uVar17 = uVar12 >> 0x20;
      uVar4 = uVar5 * (local_78 & 0xffffffff);
      uVar7 = uVar7 * uVar17;
      uVar10 = uVar7 + uVar4;
      uVar13 = local_80 * uVar12;
      local_90 = (ulong)(uVar13 < uVar10 << 0x20);
      uVar16 = uVar11 * uVar5 + uVar13 + local_50 + ((ulong)CARRY8(uVar9,uVar3) << 0x20) + local_48
               + (ulong)(uVar15 < uVar14);
      uVar14 = (local_78 & 0xffffffff) * local_40;
      uVar3 = (local_88 & 0xffffffff) * uVar17;
      uVar9 = uVar3 + uVar14;
      uVar11 = local_88 * uVar12;
      uVar3 = (uVar9 >> 0x20) + uVar17 * local_40 + ((ulong)CARRY8(uVar3,uVar14) << 0x20) +
              (ulong)(uVar11 < uVar9 << 0x20) + (ulong)CARRY8(uVar11,uVar15);
      uVar9 = uVar3 + uVar16;
      uVar14 = uVar9 + local_58;
      uVar6 = uVar5 * uVar17 + uVar12 + (uVar10 >> 0x20) + ((ulong)CARRY8(uVar7,uVar4) << 0x20) +
              local_90 + (ulong)(uVar16 < uVar13) + (ulong)CARRY8(uVar3,uVar16) +
              (ulong)CARRY8(uVar9,local_58);
      uVar7 = (ulong)(local_60 != 0) | uVar11 + uVar15;
      if (uVar6 >> 0x31 == 0) {
        zExp = local_98 + local_94 + -0x4000;
      }
      else {
        uVar3 = uVar6 << 0x3f;
        uVar6 = uVar6 >> 1;
        uVar7 = (ulong)(uVar7 != 0) | uVar14 << 0x3f;
        zExp = local_98 + local_94 + -0x3fff;
        uVar14 = uVar3 | uVar14 >> 1;
      }
      local_38._0_1_ = (byte)(uVar8 >> 0x3f);
      zSign = (byte)local_38;
      local_78 = uVar12;
      local_70 = status;
      local_38 = uVar8 >> 0x3f;
      fVar18 = roundAndPackFloat128(zSign,zExp,uVar6,uVar14,uVar7,status);
      return fVar18;
    }
    if (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        uVar6 != 0) goto LAB_00b438ac;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_58 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0)
    goto LAB_00b43b1d;
  }
  uVar8 = uVar8 & 0x8000000000000000 | 0x7fff000000000000;
LAB_00b43b2d:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar8;
  return (float128)(auVar2 << 0x40);
}

Assistant:

float128 float128_mul(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1, zSig2, zSig3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    bSign = extractFloat128Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if (    ( aSig0 | aSig1 )
             || ( ( bExp == 0x7FFF ) && ( bSig0 | bSig1 ) ) ) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( bExp | bSig0 | bSig1 ) == 0 ) goto invalid;
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) {
 invalid:
            float_raise(float_flag_invalid, status);
            return float128_default_nan(status);
        }
        return packFloat128( zSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    if ( bExp == 0 ) {
        if ( ( bSig0 | bSig1 ) == 0 ) return packFloat128( zSign, 0, 0, 0 );
        normalizeFloat128Subnormal( bSig0, bSig1, &bExp, &bSig0, &bSig1 );
    }
    zExp = aExp + bExp - 0x4000;
    aSig0 |= UINT64_C(0x0001000000000000);
    shortShift128Left( bSig0, bSig1, 16, &bSig0, &bSig1 );
    mul128To256( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1, &zSig2, &zSig3 );
    add128( zSig0, zSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zSig2 |= ( zSig3 != 0 );
    if (UINT64_C( 0x0002000000000000) <= zSig0 ) {
        shift128ExtraRightJamming(
            zSig0, zSig1, zSig2, 1, &zSig0, &zSig1, &zSig2 );
        ++zExp;
    }
    return roundAndPackFloat128(zSign, zExp, zSig0, zSig1, zSig2, status);

}